

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocations.cpp
# Opt level: O0

void Allocations::collectAreaStats(AllocationStats *stats)

{
  bool bVar1;
  reference __src;
  long lVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  int64_t extraout_RDX_01;
  Key key;
  Key key_00;
  Key key_01;
  int64_t newUsageEnd;
  int64_t lastUsageEnd;
  pair<const_Allocations::Key,_Allocations::Usage> it;
  iterator __end1;
  iterator __begin1;
  map<Allocations::Key,_Allocations::Usage,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
  *__range1;
  anon_class_8_1_a8a4b3bf applyUsage;
  Usage lastUsage;
  int64_t lastEndPosition;
  Key lastKey;
  AllocationStats *stats_local;
  
  lastEndPosition = -1;
  lastKey.fileID = -1;
  lastUsage.usesFill = true;
  lastUsage.shared = true;
  lastUsage._18_6_ = 0xffffffffffff;
  memset(&applyUsage,0,0x18);
  __range1 = (map<Allocations::Key,_Allocations::Usage,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
              *)stats;
  __end1 = std::
           map<Allocations::Key,_Allocations::Usage,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
           ::begin(&allocations);
  it.second._16_8_ =
       std::
       map<Allocations::Key,_Allocations::Usage,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
       ::end(&allocations);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&it.second.usesFill);
    if (!bVar1) break;
    __src = std::_Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::Usage>_>::
            operator*(&__end1);
    memcpy(&lastUsageEnd,__src,0x28);
    if (((lastUsageEnd == lastEndPosition) && (lastKey.fileID < it.first.fileID)) &&
       (it.first.fileID < (long)lastUsage._16_8_)) {
      lVar2 = it.first.fileID + it.second.space;
      key.position = extraout_RDX;
      key.fileID = it.first.fileID;
      iVar3 = getSubAreaUsage((Allocations *)lastUsageEnd,key);
      iVar4 = it.second.space;
      if (lastKey.fileID + lastUsage.space < it.first.fileID) {
        key_00.position = extraout_RDX_00;
        key_00.fileID = it.first.fileID;
        iVar3 = getSubAreaUsage((Allocations *)lastUsageEnd,key_00);
        lVar2 = iVar4 + iVar3;
      }
      else {
        lVar2 = (lVar2 + iVar3) - (lastKey.fileID + lastUsage.space);
      }
      lastUsage.space = lVar2 + lastUsage.space;
      lastUsage._16_8_ = it.first.fileID + it.first.position;
      applyUsage.stats = (AllocationStats *)(lastUsage._16_8_ - lastKey.fileID);
    }
    else {
      iVar4 = extraout_RDX;
      if (lastKey.fileID != -1) {
        collectAreaStats::anon_class_8_1_a8a4b3bf::operator()
                  ((anon_class_8_1_a8a4b3bf *)&__range1,lastKey.fileID,(Usage *)&applyUsage);
        iVar4 = extraout_RDX_01;
      }
      iVar3 = it.second.space;
      lastEndPosition = lastUsageEnd;
      lastKey.fileID = it.first.fileID;
      applyUsage.stats = (AllocationStats *)it.first.position;
      key_01.position = iVar4;
      key_01.fileID = it.first.fileID;
      iVar4 = getSubAreaUsage((Allocations *)lastUsageEnd,key_01);
      lastUsage.space = iVar4 + iVar3;
      lastUsage._16_8_ = it.first.fileID + it.first.position;
    }
    std::_Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::Usage>_>::operator++
              (&__end1);
  }
  if (lastKey.fileID != -1) {
    collectAreaStats::anon_class_8_1_a8a4b3bf::operator()
              ((anon_class_8_1_a8a4b3bf *)&__range1,lastKey.fileID,(Usage *)&applyUsage);
  }
  return;
}

Assistant:

void Allocations::collectAreaStats(AllocationStats &stats)
{
	// Need to work out overlaps.
	Key lastKey{ -1, -1 };
	int64_t lastEndPosition = -1;
	Usage lastUsage{};

	auto applyUsage = [&stats](int64_t position, const Usage &usage)
	{
		if (usage.space > stats.largestSize)
		{
			stats.largestPosition = position;
			stats.largestSize = usage.space;
			stats.largestUsage = usage.usage;
		}

		if (usage.space - usage.usage > stats.largestFreeSize - stats.largestFreeUsage)
		{
			stats.largestFreePosition = position;
			stats.largestFreeSize = usage.space;
			stats.largestFreeUsage = usage.usage;
		}

		// We assume overlaps agree on sharing, hopefully...
		if (usage.shared && usage.space - usage.usage > stats.sharedFreeSize - stats.sharedFreeUsage)
		{
			stats.sharedFreePosition = position;
			stats.sharedFreeSize = usage.space;
			stats.sharedFreeUsage = usage.usage;
		}

		stats.totalSize += usage.space;
		stats.totalUsage += usage.usage;
		if (usage.shared)
		{
			stats.sharedSize += usage.space;
			stats.sharedUsage += usage.usage;
		}
	};

	for (auto it : allocations)
	{
		if (it.first.fileID == lastKey.fileID && it.first.position > lastKey.position && it.first.position < lastEndPosition)
		{
			// Overlap, merge.
			int64_t lastUsageEnd = lastKey.position + lastUsage.usage;
			int64_t newUsageEnd = it.first.position + it.second.usage + getSubAreaUsage(it.first);

			if (lastUsageEnd >= it.first.position)
				lastUsage.usage += newUsageEnd - lastUsageEnd;
			else
				lastUsage.usage += it.second.usage + getSubAreaUsage(it.first);

			lastEndPosition = it.first.position + it.second.space;
			lastUsage.space = lastEndPosition - lastKey.position;

			continue;
		}

		if (lastKey.position != -1)
			applyUsage(lastKey.position, lastUsage);

		lastKey = it.first;
		lastUsage = it.second;
		lastUsage.usage += getSubAreaUsage(lastKey);
		lastEndPosition = it.first.position + it.second.space;
	}

	if (lastKey.position != -1)
		applyUsage(lastKey.position, lastUsage);
}